

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

optional<slang::TimeScaleValue> slang::parseValue(string_view str,size_t *lengthConsumed)

{
  _Optional_base<slang::TimeScaleValue,_true,_true> _Var1;
  string_view str_00;
  bool bVar2;
  optional<slang::TimeScaleValue> oVar3;
  double dVar4;
  const_reference pvVar5;
  double dVar6;
  int *piVar7;
  undefined8 *in_RDX;
  TimeUnit unit_00;
  basic_string_view<char,_std::char_traits<char>_> timeSuffix;
  optional<slang::TimeUnit> unit;
  size_t unitConsumed;
  optional<int> i;
  size_t idx;
  double __n;
  uint in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  basic_string_view<char,_std::char_traits<char>_> *this;
  undefined1 in_stack_ffffffffffffffa0 [16];
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  char *in_stack_ffffffffffffffb8;
  double local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  _Storage<slang::TimeScaleValue,_true> local_3;
  bool local_1;
  
  str_00._M_len._6_2_ = in_stack_ffffffffffffffb6;
  str_00._M_len._0_6_ = in_stack_ffffffffffffffb0;
  str_00._M_str = in_stack_ffffffffffffffb8;
  strToInt(str_00,in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._4_4_);
  bVar2 = std::optional::operator_cast_to_bool((optional<int> *)0x360fb2);
  if (bVar2) {
    while( true ) {
      __n = local_28;
      dVar4 = (double)std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 & 0xffffff;
      if ((ulong)__n < (ulong)dVar4) {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_18,(size_type)local_28);
        in_stack_ffffffffffffff98 = CONCAT13(*pvVar5 == ' ',(int3)in_stack_ffffffffffffff98);
      }
      this = in_stack_ffffffffffffffa0._0_8_;
      if ((char)(in_stack_ffffffffffffff98 >> 0x18) == '\0') break;
      local_28 = (double)((long)local_28 + 1);
    }
    dVar4 = local_28;
    dVar6 = (double)std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if ((ulong)dVar4 < (ulong)dVar6) {
      timeSuffix = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (this,CONCAT17(in_stack_ffffffffffffff9f,
                                            CONCAT16(in_stack_ffffffffffffff9e,
                                                     CONCAT24(in_stack_ffffffffffffff9c,
                                                              in_stack_ffffffffffffff98))),
                              (size_type)__n);
      suffixToTimeUnit(timeSuffix,
                       (size_t *)
                       CONCAT17(in_stack_ffffffffffffff9f,
                                CONCAT16(in_stack_ffffffffffffff9e,
                                         CONCAT24(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98))));
      bVar2 = std::optional::operator_cast_to_bool((optional<slang::TimeUnit> *)0x36109d);
      if (bVar2) {
        *in_RDX = in_stack_ffffffffffffffb8 + (long)local_28;
        piVar7 = std::optional<int>::operator*((optional<int> *)0x3610cf);
        unit_00 = (TimeUnit)((ulong)(double)*piVar7 >> 0x38);
        std::optional<slang::TimeUnit>::operator*((optional<slang::TimeUnit> *)0x3610e3);
        oVar3 = TimeScaleValue::fromLiteral(dVar4,unit_00);
        local_3 = oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::TimeScaleValue>._M_payload;
        local_1 = oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::TimeScaleValue>._M_engaged;
      }
      else {
        std::optional<slang::TimeScaleValue>::optional((optional<slang::TimeScaleValue> *)0x3610ae);
      }
    }
    else {
      std::optional<slang::TimeScaleValue>::optional((optional<slang::TimeScaleValue> *)0x361055);
    }
  }
  else {
    std::optional<slang::TimeScaleValue>::optional((optional<slang::TimeScaleValue> *)0x360fc3);
  }
  _Var1._M_payload.super__Optional_payload_base<slang::TimeScaleValue>._M_engaged = local_1;
  _Var1._M_payload.super__Optional_payload_base<slang::TimeScaleValue>._M_payload = local_3;
  return (_Optional_base<slang::TimeScaleValue,_true,_true>)
         (_Optional_base<slang::TimeScaleValue,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<slang::TimeScaleValue>;
}

Assistant:

static std::optional<TimeScaleValue> parseValue(std::string_view str, size_t& lengthConsumed) {
    size_t idx;
    auto i = strToInt(str, &idx);
    if (!i)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size())
        return {};

    size_t unitConsumed;
    auto unit = suffixToTimeUnit(str.substr(idx), unitConsumed);
    if (!unit)
        return {};

    lengthConsumed = idx + unitConsumed;
    return TimeScaleValue::fromLiteral(double(*i), *unit);
}